

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseStartTag(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar **ppxVar3;
  bool bVar4;
  xmlChar **n;
  int indx;
  int discardtag;
  int i;
  int meta;
  int maxatts;
  int nbatts;
  xmlChar **atts;
  xmlChar *attvalue;
  xmlChar *attname;
  xmlChar *name;
  htmlParserCtxtPtr ctxt_local;
  
  meta = 0;
  n._4_4_ = 0;
  name = (xmlChar *)ctxt;
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) {
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseStartTag: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt_local._4_4_ = -1;
  }
  else if (ctxt->instate == XML_PARSER_EOF) {
    ctxt_local._4_4_ = -1;
  }
  else if (*ctxt->input->cur == '<') {
    xmlNextChar(ctxt);
    _maxatts = *(xmlChar ***)(name + 0x1d0);
    i = *(int *)(name + 0x1d8);
    if ((*(int *)(name + 0x1c4) == 0) &&
       (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) < 0xfa))
    {
      xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
    }
    attname = htmlParseHTMLName((htmlParserCtxtPtr)name);
    if (attname == (xmlChar *)0x0) {
      htmlParseErr((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                   "htmlParseStartTag: invalid element name\n",(xmlChar *)0x0,(xmlChar *)0x0);
      if ((*(int *)(name + 0x1c0) == 0) ||
         (((**(char **)(*(long *)(name + 0x38) + 0x20) != ' ' &&
           ((**(byte **)(*(long *)(name + 0x38) + 0x20) < 9 ||
            (10 < **(byte **)(*(long *)(name + 0x38) + 0x20))))) &&
          ((**(char **)(*(long *)(name + 0x38) + 0x20) != '\r' &&
           (((**(char **)(*(long *)(name + 0x38) + 0x20) != '<' &&
             (**(char **)(*(long *)(name + 0x38) + 0x20) != '=')) &&
            ((**(char **)(*(long *)(name + 0x38) + 0x20) != '>' &&
             ((**(byte **)(*(long *)(name + 0x38) + 0x20) < 0x30 ||
              (0x39 < **(byte **)(*(long *)(name + 0x38) + 0x20))))))))))))) {
        while( true ) {
          bVar4 = false;
          if ((**(char **)(*(long *)(name + 0x38) + 0x20) != '\0') &&
             (bVar4 = false, **(char **)(*(long *)(name + 0x38) + 0x20) != '>')) {
            bVar4 = *(int *)(name + 0x110) != -1;
          }
          if (!bVar4) break;
          xmlNextChar((xmlParserCtxtPtr)name);
        }
        ctxt_local._4_4_ = -1;
      }
      else {
        htmlParseCharDataInternal((htmlParserCtxtPtr)name,0x3c);
        ctxt_local._4_4_ = -1;
      }
    }
    else {
      iVar1 = xmlStrEqual(attname,(xmlChar *)"meta");
      htmlAutoClose((htmlParserCtxtPtr)name,attname);
      htmlCheckImplied((htmlParserCtxtPtr)name,attname);
      if ((0 < *(int *)(name + 0x128)) && (iVar2 = xmlStrEqual(attname,"html"), iVar2 != 0)) {
        htmlParseErr((xmlParserCtxtPtr)name,XML_HTML_STRUCURE_ERROR,
                     "htmlParseStartTag: misplaced <html> tag\n",attname,(xmlChar *)0x0);
        n._4_4_ = 1;
        *(int *)(name + 0x188) = *(int *)(name + 0x188) + 1;
      }
      if ((*(int *)(name + 0x128) != 1) && (iVar2 = xmlStrEqual(attname,"head"), iVar2 != 0)) {
        htmlParseErr((xmlParserCtxtPtr)name,XML_HTML_STRUCURE_ERROR,
                     "htmlParseStartTag: misplaced <head> tag\n",attname,(xmlChar *)0x0);
        n._4_4_ = 1;
        *(int *)(name + 0x188) = *(int *)(name + 0x188) + 1;
      }
      iVar2 = xmlStrEqual(attname,"body");
      if (iVar2 != 0) {
        for (n._0_4_ = 0; (int)n < *(int *)(name + 0x128); n._0_4_ = (int)n + 1) {
          iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x130) + (long)(int)n * 8),"body");
          if (iVar2 != 0) {
            htmlParseErr((xmlParserCtxtPtr)name,XML_HTML_STRUCURE_ERROR,
                         "htmlParseStartTag: misplaced <body> tag\n",attname,(xmlChar *)0x0);
            n._4_4_ = 1;
            *(int *)(name + 0x188) = *(int *)(name + 0x188) + 1;
          }
        }
      }
      htmlSkipBlankChars((xmlParserCtxtPtr)name);
      while( true ) {
        bVar4 = false;
        if (((**(char **)(*(long *)(name + 0x38) + 0x20) != '\0') &&
            (bVar4 = false, **(char **)(*(long *)(name + 0x38) + 0x20) != '>')) &&
           (bVar4 = true, **(char **)(*(long *)(name + 0x38) + 0x20) == '/')) {
          bVar4 = *(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) != '>';
        }
        if (!bVar4) break;
        if ((*(int *)(name + 0x1c4) == 0) &&
           (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) <
            0xfa)) {
          xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
        }
        attvalue = htmlParseAttribute((htmlParserCtxtPtr)name,(xmlChar **)&atts);
        if (attvalue == (xmlChar *)0x0) {
          if (atts != (xmlChar **)0x0) {
            (*xmlFree)(atts);
          }
          while( true ) {
            bVar4 = false;
            if (((**(char **)(*(long *)(name + 0x38) + 0x20) != '\0') &&
                (bVar4 = false, **(char **)(*(long *)(name + 0x38) + 0x20) != ' ')) &&
               (((**(byte **)(*(long *)(name + 0x38) + 0x20) < 9 ||
                 (bVar4 = false, 10 < **(byte **)(*(long *)(name + 0x38) + 0x20))) &&
                (((bVar4 = false, **(char **)(*(long *)(name + 0x38) + 0x20) != '\r' &&
                  (bVar4 = false, **(char **)(*(long *)(name + 0x38) + 0x20) != '>')) &&
                 (bVar4 = true, **(char **)(*(long *)(name + 0x38) + 0x20) == '/')))))) {
              bVar4 = *(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) != '>';
            }
            if (!bVar4) break;
            xmlNextChar((xmlParserCtxtPtr)name);
          }
        }
        else {
          for (indx = 0; indx < meta; indx = indx + 2) {
            iVar2 = xmlStrEqual(_maxatts[indx],attvalue);
            if (iVar2 != 0) {
              htmlParseErr((xmlParserCtxtPtr)name,XML_ERR_ATTRIBUTE_REDEFINED,
                           "Attribute %s redefined\n",attvalue,(xmlChar *)0x0);
              if (atts != (xmlChar **)0x0) {
                (*xmlFree)(atts);
              }
              goto LAB_0015be71;
            }
          }
          if (_maxatts == (xmlChar **)0x0) {
            i = 0x16;
            _maxatts = (xmlChar **)(*xmlMalloc)(0xb0);
            if (_maxatts == (xmlChar **)0x0) {
              htmlErrMemory((xmlParserCtxtPtr)name,(char *)0x0);
              if (atts != (xmlChar **)0x0) {
                (*xmlFree)(atts);
              }
              goto LAB_0015be71;
            }
            *(xmlChar ***)(name + 0x1d0) = _maxatts;
            name[0x1d8] = '\x16';
            name[0x1d9] = '\0';
            name[0x1da] = '\0';
            name[0x1db] = '\0';
          }
          else if (i < meta + 4) {
            i = i << 1;
            ppxVar3 = (xmlChar **)(*xmlRealloc)(_maxatts,(long)i << 3);
            if (ppxVar3 == (xmlChar **)0x0) {
              htmlErrMemory((xmlParserCtxtPtr)name,(char *)0x0);
              if (atts != (xmlChar **)0x0) {
                (*xmlFree)(atts);
              }
              goto LAB_0015be71;
            }
            *(xmlChar ***)(name + 0x1d0) = ppxVar3;
            *(int *)(name + 0x1d8) = i;
            _maxatts = ppxVar3;
          }
          _maxatts[meta] = attvalue;
          _maxatts[meta + 1] = (xmlChar *)atts;
          _maxatts[meta + 2] = (xmlChar *)0x0;
          _maxatts[meta + 3] = (xmlChar *)0x0;
          meta = meta + 2;
        }
LAB_0015be71:
        htmlSkipBlankChars((xmlParserCtxtPtr)name);
      }
      if ((iVar1 != 0) && (meta != 0)) {
        htmlCheckMeta((htmlParserCtxtPtr)name,_maxatts);
      }
      if (((n._4_4_ == 0) && (htmlnamePush((htmlParserCtxtPtr)name,attname), *(long *)name != 0)) &&
         (*(long *)(*(long *)name + 0x70) != 0)) {
        if (meta == 0) {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,0);
        }
        else {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,_maxatts);
        }
      }
      if (_maxatts != (xmlChar **)0x0) {
        for (indx = 1; indx < meta; indx = indx + 2) {
          if (_maxatts[indx] != (xmlChar *)0x0) {
            (*xmlFree)(_maxatts[indx]);
          }
        }
      }
      ctxt_local._4_4_ = n._4_4_;
    }
  }
  else {
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
htmlParseStartTag(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts;
    int nbatts = 0;
    int maxatts;
    int meta = 0;
    int i;
    int discardtag = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseStartTag: context error\n", NULL, NULL);
	return -1;
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (CUR != '<') return -1;
    NEXT;

    atts = ctxt->atts;
    maxatts = ctxt->maxatts;

    GROW;
    name = htmlParseHTMLName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseStartTag: invalid element name\n",
		     NULL, NULL);
	/* if recover preserve text on classic misconstructs */
	if ((ctxt->recovery) && ((IS_BLANK_CH(CUR)) || (CUR == '<') ||
	    (CUR == '=') || (CUR == '>') || (((CUR >= '0') && (CUR <= '9'))))) {
	    htmlParseCharDataInternal(ctxt, '<');
	    return(-1);
	}


	/* Dump the bogus tag like browsers do */
	while ((CUR != 0) && (CUR != '>') &&
               (ctxt->instate != XML_PARSER_EOF))
	    NEXT;
        return -1;
    }
    if (xmlStrEqual(name, BAD_CAST"meta"))
	meta = 1;

    /*
     * Check for auto-closure of HTML elements.
     */
    htmlAutoClose(ctxt, name);

    /*
     * Check for implied HTML elements.
     */
    htmlCheckImplied(ctxt, name);

    /*
     * Avoid html at any level > 0, head at any level != 1
     * or any attempt to recurse body
     */
    if ((ctxt->nameNr > 0) && (xmlStrEqual(name, BAD_CAST"html"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <html> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if ((ctxt->nameNr != 1) &&
	(xmlStrEqual(name, BAD_CAST"head"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <head> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if (xmlStrEqual(name, BAD_CAST"body")) {
	int indx;
	for (indx = 0;indx < ctxt->nameNr;indx++) {
	    if (xmlStrEqual(ctxt->nameTab[indx], BAD_CAST"body")) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "htmlParseStartTag: misplaced <body> tag\n",
			     name, NULL);
		discardtag = 1;
		ctxt->depth++;
	    }
	}
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    while ((CUR != 0) &&
           (CUR != '>') &&
	   ((CUR != '/') || (NXT(1) != '>'))) {
	GROW;
	attname = htmlParseAttribute(ctxt, &attvalue);
        if (attname != NULL) {

	    /*
	     * Well formedness requires at most one declaration of an attribute
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    htmlParseErr(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
		                 "Attribute %s redefined\n", attname, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
	    }

	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	}
	else {
	    if (attvalue != NULL)
	        xmlFree(attvalue);
	    /* Dump the bogus attribute string up to the next blank or
	     * the end of the tag. */
	    while ((CUR != 0) &&
	           !(IS_BLANK_CH(CUR)) && (CUR != '>') &&
		   ((CUR != '/') || (NXT(1) != '>')))
		NEXT;
	}

failed:
	SKIP_BLANKS;
    }

    /*
     * Handle specific association to the META tag
     */
    if (meta && (nbatts != 0))
	htmlCheckMeta(ctxt, atts);

    /*
     * SAX: Start of Element !
     */
    if (!discardtag) {
	htmlnamePush(ctxt, name);
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL)) {
	    if (nbatts != 0)
		ctxt->sax->startElement(ctxt->userData, name, atts);
	    else
		ctxt->sax->startElement(ctxt->userData, name, NULL);
	}
    }

    if (atts != NULL) {
        for (i = 1;i < nbatts;i += 2) {
	    if (atts[i] != NULL)
		xmlFree((xmlChar *) atts[i]);
	}
    }

    return(discardtag);
}